

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractListView<QImage>::resizeEvent(AbstractListView<QImage> *this,QResizeEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AbstractListViewPrivate<QImage> *pAVar4;
  QSize *this_00;
  QPoint *this_01;
  AbstractListViewPrivate<QImage> *d;
  QResizeEvent *e_local;
  AbstractListView<QImage> *this_local;
  
  AbstractScrollArea::resizeEvent((AbstractScrollArea *)this,e);
  (**(code **)(*(long *)&(this->super_AbstractListViewBase).super_AbstractScrollArea + 0x1b8))();
  pAVar4 = d_func(this);
  if (pAVar4->model != (ListModel<QImage> *)0x0) {
    this_00 = AbstractScrollArea::scrolledAreaSize((AbstractScrollArea *)this);
    iVar1 = QSize::height(this_00);
    this_01 = AbstractScrollArea::topLeftPointShownArea((AbstractScrollArea *)this);
    iVar2 = QPoint::y(this_01);
    iVar3 = QWidget::height((pAVar4->super_AbstractListViewBasePrivate).
                            super_AbstractScrollAreaPrivate.viewport);
    if (iVar1 - iVar2 <= iVar3) {
      iVar1 = (**(code **)(*(long *)&pAVar4->model->super_AbstractListModel + 0x80))();
      scrollTo(this,iVar1 + -1,PositionAtBottom);
    }
  }
  return;
}

Assistant:

void resizeEvent( QResizeEvent * e ) override
	{
		AbstractListViewBase::resizeEvent( e );

		recalculateSize();

		AbstractListViewPrivate< T > * d = d_func();

		if( d->model &&
			scrolledAreaSize().height() - topLeftPointShownArea().y() <=
				d->viewport->height() )
				scrollTo( d->model->rowCount() - 1, PositionAtBottom );
	}